

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::DeadBranchElimPass::SimplifyBranch
          (DeadBranchElimPass *this,BasicBlock *block,uint32_t live_lab_id)

{
  StructuredCFGAnalysis *this_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t loop_merge_id;
  uint32_t loop_continue_id;
  uint32_t switch_merge_id;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_01;
  Instruction *pIVar3;
  Instruction **ppIVar4;
  BasicBlock *pBVar5;
  mapped_type *ppBVar6;
  Operand *__x;
  Instruction *pIVar7;
  uint uVar8;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> inst;
  IRContext *pIVar9;
  OperandList new_operands;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_a8;
  undefined1 local_88 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_60;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  this_01._M_head_impl = BasicBlock::GetMergeInst(block);
  pIVar3 = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar3 == (Instruction *)0x0) ||
     ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
    __assert_fail("!insts_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                  ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
  }
  inst._M_head_impl =
       (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
       super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
  if (((tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
       this_01._M_head_impl == (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)0x0) ||
     ((this_01._M_head_impl)->opcode_ != OpSelectionMerge)) {
    AddBranch(this,live_lab_id,block);
    pIVar9 = (this->super_MemPass).super_Pass.context_;
  }
  else {
    pIVar3 = ((this_01._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
             next_node_;
    uVar2 = 0;
    pIVar7 = (Instruction *)0x0;
    if ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
      pIVar7 = pIVar3;
    }
    if (pIVar7->opcode_ == OpSwitch) {
      pIVar3 = (block->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar3->has_result_id_ == true) {
        uVar2 = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
      }
      bVar1 = SwitchHasNestedBreak(this,uVar2);
      if (bVar1) {
        uVar8 = ((inst._M_head_impl)->has_result_id_ & 1) + 1;
        if ((inst._M_head_impl)->has_type_id_ == false) {
          uVar8 = (uint)(inst._M_head_impl)->has_result_id_;
        }
        if ((int)((ulong)((long)((inst._M_head_impl)->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)((inst._M_head_impl)->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
            uVar8 != 2) {
          local_a8.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          __x = Instruction::GetInOperand(inst._M_head_impl,0);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    (&local_a8,__x);
          local_58._24_8_ = local_58 + 0x10;
          local_58._0_8_ = &PTR__SmallVector_003e9b28;
          local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_58._8_8_ = 1;
          local_88._0_4_ = 1;
          local_88._8_8_ = &PTR__SmallVector_003e9b28;
          local_88._16_8_ = 0;
          local_88._32_8_ = local_88 + 0x18;
          local_60._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_58._16_4_ = live_lab_id;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)(local_88 + 8),
                     (SmallVector<unsigned_int,_2UL> *)local_58);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
          emplace_back<spvtools::opt::Operand>(&local_a8,(Operand *)local_88);
          local_88._8_8_ = &PTR__SmallVector_003e9b28;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )local_60._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
          {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_60,local_60._M_head_impl);
          }
          local_60._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_58._0_8_ = &PTR__SmallVector_003e9b28;
          if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_38,local_38._M_head_impl);
          }
          uVar8 = ((inst._M_head_impl)->has_result_id_ & 1) + 1;
          if ((inst._M_head_impl)->has_type_id_ == false) {
            uVar8 = (uint)(inst._M_head_impl)->has_result_id_;
          }
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                    (&(inst._M_head_impl)->operands_,
                     (Operand *)
                     ((long)(((((inst._M_head_impl)->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start)->words).buffer + -6) +
                     (ulong)(uVar8 * 0x30)),
                     ((inst._M_head_impl)->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                     &(inst._M_head_impl)->operands_,
                     ((inst._M_head_impl)->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     local_a8.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_a8.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          pIVar9 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar9->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
            analysis::DefUseManager::UpdateDefUse
                      ((pIVar9->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,inst._M_head_impl);
          }
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    (&local_a8);
          return true;
        }
        return false;
      }
    }
    pIVar9 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar9->valid_analyses_ & kAnalysisStructuredCFG) == kAnalysisNone) {
      IRContext::BuildStructuredCFGAnalysis(pIVar9);
    }
    this_00 = (pIVar9->struct_cfg_analysis_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
              .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>._M_head_impl;
    uVar2 = ((this_01._M_head_impl)->has_result_id_ & 1) + 1;
    if ((this_01._M_head_impl)->has_type_id_ == false) {
      uVar2 = (uint)(this_01._M_head_impl)->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(this_01._M_head_impl,uVar2);
    loop_merge_id = StructuredCFGAnalysis::LoopMergeBlock(this_00,live_lab_id);
    loop_continue_id = StructuredCFGAnalysis::LoopContinueBlock(this_00,live_lab_id);
    switch_merge_id = StructuredCFGAnalysis::SwitchMergeBlock(this_00,live_lab_id);
    pIVar3 = FindFirstExitFromSelectionMerge
                       (this,live_lab_id,uVar2,loop_merge_id,loop_continue_id,switch_merge_id);
    AddBranch(this,live_lab_id,block);
    IRContext::KillInst((this->super_MemPass).super_Pass.context_,inst._M_head_impl);
    if (pIVar3 != (Instruction *)0x0) {
      if (((this_01._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_
          == true) {
        __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xca,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                     );
      }
      ppIVar4 = &((this_01._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                 next_node_;
      pIVar7 = *ppIVar4;
      if (pIVar7 != (Instruction *)0x0) {
        (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
             ((this_01._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
             previous_node_;
        ((((this_01._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
         previous_node_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar7;
        *ppIVar4 = (Instruction *)0x0;
        ((this_01._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_
             = (Instruction *)0x0;
        local_88._0_8_ = this_01._M_head_impl;
        Instruction::InsertBefore
                  (pIVar3,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                           *)local_88);
        if ((Instruction *)local_88._0_8_ != (Instruction *)0x0) {
          (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_88._0_8_)->
            _vptr_IntrusiveNodeBase[1])();
        }
        pIVar9 = (this->super_MemPass).super_Pass.context_;
        pBVar5 = IRContext::get_instr_block(pIVar9,pIVar3);
        if ((pIVar9->valid_analyses_ & kAnalysisInstrToBlockMapping) == kAnalysisNone) {
          return true;
        }
        local_88._0_8_ = this_01._M_head_impl;
        ppBVar6 = std::__detail::
                  _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&pIVar9->instr_to_block_,(key_type *)local_88);
        *ppBVar6 = pBVar5;
        return true;
      }
      __assert_fail("this->IsInAList() && \"Cannot remove a node from a list if it is not in a list.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xcc,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                   );
    }
    pIVar9 = (this->super_MemPass).super_Pass.context_;
    inst._M_head_impl = this_01._M_head_impl;
  }
  IRContext::KillInst(pIVar9,inst._M_head_impl);
  return true;
}

Assistant:

bool DeadBranchElimPass::SimplifyBranch(BasicBlock* block,
                                        uint32_t live_lab_id) {
  Instruction* merge_inst = block->GetMergeInst();
  Instruction* terminator = block->terminator();
  if (merge_inst && merge_inst->opcode() == spv::Op::OpSelectionMerge) {
    if (merge_inst->NextNode()->opcode() == spv::Op::OpSwitch &&
        SwitchHasNestedBreak(block->id())) {
      if (terminator->NumInOperands() == 2) {
        // We cannot remove the branch, and it already has a single case, so no
        // work to do.
        return false;
      }
      // We have to keep the switch because it has a nest break, so we
      // remove all cases except for the live one.
      Instruction::OperandList new_operands;
      new_operands.push_back(terminator->GetInOperand(0));
      new_operands.push_back({SPV_OPERAND_TYPE_ID, {live_lab_id}});
      terminator->SetInOperands(std::move(new_operands));
      context()->UpdateDefUse(terminator);
    } else {
      // Check if the merge instruction is still needed because of a
      // non-nested break from the construct.  Move the merge instruction if
      // it is still needed.
      StructuredCFGAnalysis* cfg_analysis =
          context()->GetStructuredCFGAnalysis();
      Instruction* first_break = FindFirstExitFromSelectionMerge(
          live_lab_id, merge_inst->GetSingleWordInOperand(0),
          cfg_analysis->LoopMergeBlock(live_lab_id),
          cfg_analysis->LoopContinueBlock(live_lab_id),
          cfg_analysis->SwitchMergeBlock(live_lab_id));

      AddBranch(live_lab_id, block);
      context()->KillInst(terminator);
      if (first_break == nullptr) {
        context()->KillInst(merge_inst);
      } else {
        merge_inst->RemoveFromList();
        first_break->InsertBefore(std::unique_ptr<Instruction>(merge_inst));
        context()->set_instr_block(merge_inst,
                                   context()->get_instr_block(first_break));
      }
    }
  } else {
    AddBranch(live_lab_id, block);
    context()->KillInst(terminator);
  }
  return true;
}